

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O2

int Bac_ObjDup(Bac_Ntk_t *pNew,Bac_Ntk_t *p,int i)

{
  Bac_ObjType_t Type;
  int iVar1;
  int iVar2;
  
  Type = Bac_ObjType(p,i);
  iVar1 = Bac_ObjIsBox(p,i);
  if (iVar1 == 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = Bac_BoxNtkId(p,i);
  }
  iVar1 = Bac_ObjAlloc(pNew,Type,iVar1);
  if (((p->vName).pArray != (int *)0x0) && ((pNew->vName).pArray != (int *)0x0)) {
    iVar2 = Bac_ObjIsCo(p,i);
    if (iVar2 == 0) {
      iVar2 = Bac_ObjName(p,i);
      Bac_ObjSetName(pNew,iVar1,iVar2);
    }
  }
  Bac_ObjSetCopy(p,i,iVar1);
  return iVar1;
}

Assistant:

static inline int Bac_ObjDup( Bac_Ntk_t * pNew, Bac_Ntk_t * p, int i )
{
    int iObj = Bac_ObjAlloc( pNew, Bac_ObjType(p, i), Bac_ObjIsBox(p, i) ? Bac_BoxNtkId(p, i) : -1 );
    if ( Bac_NtkHasNames(p) && Bac_NtkHasNames(pNew) && !Bac_ObjIsCo(p, i) ) 
        Bac_ObjSetName( pNew, iObj, Bac_ObjName(p, i) );
    Bac_ObjSetCopy( p, i, iObj );
    return iObj;
}